

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O1

shared_ptr<mini_bus::IBaseNotifyToken<void>_> __thiscall
mini_bus::MiniBusClient::notify(MiniBusClient *this,string_view key,string_view value)

{
  ostream *poVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_R9;
  string_view command;
  string_view payload;
  shared_ptr<mini_bus::IBaseNotifyToken<void>_> sVar2;
  __string_type buf;
  ostringstream oss;
  undefined1 local_1d8 [160];
  ios_base local_138 [264];
  
  command._M_len = key._M_len;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d8 + 0x30));
  local_1d8[0x10] = key._M_str._0_1_;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1d8 + 0x30),local_1d8 + 0x10,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)value._M_len,(long)key._M_str);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1d8 + 0x30),in_R9,(long)value._M_str);
  std::__cxx11::stringbuf::str();
  command._M_str = (char *)0x6;
  payload._M_str = (char *)local_1d8._24_8_;
  payload._M_len = (size_t)"NOTIFY";
  send_simple_abi_cxx11_((MiniBusClient *)local_1d8,command,payload);
  operator>><std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_codehz[P]mini_bus_cpp_include_mini_bus_hpp:547:42)>
            ((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,(anon_class_1_0_00000001_for_func *)local_1d8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
  }
  if ((undefined1 *)CONCAT71(local_1d8._17_7_,local_1d8[0x10]) != local_1d8 + 0x20) {
    operator_delete((undefined1 *)CONCAT71(local_1d8._17_7_,local_1d8[0x10]),
                    (ulong)(local_1d8._32_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d8 + 0x30));
  std::ios_base::~ios_base(local_138);
  sVar2.super___shared_ptr<mini_bus::IBaseNotifyToken<void>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mini_bus::IBaseNotifyToken<void>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mini_bus::IBaseNotifyToken<void>_>)
         sVar2.super___shared_ptr<mini_bus::IBaseNotifyToken<void>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<void>> notify(std::string_view key, std::string_view value) {
    std::ostringstream oss;
    oss << (unsigned char) key.length() << key;
    oss << value;
    auto buf = oss.str();
    return send_simple("NOTIFY", buf) >> [](std::optional<std::string> str) { return; };
  }